

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

OpenApiVersion
rapidjson::
GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::GetOpenApiVersion(ValueType *document)

{
  bool bVar1;
  SizeType SVar2;
  int iVar3;
  ValueType *pVVar4;
  ConstMemberIterator CVar5;
  ConstMemberIterator CVar6;
  Ch *pCVar7;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *rhs
  ;
  OpenApiVersion OVar8;
  ValueType kVersion31Value;
  ValueType kVersion30Value;
  ValueType kVersion20Value;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_38;
  
  if ((GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
       ::
       GetOpenApiVersion(rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>const&)
       ::len == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
                                   ::
                                   GetOpenApiVersion(rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>const&)
                                   ::len), iVar3 != 0)) {
    GetOpenApiVersion::len = 4;
    __cxa_guard_release(&GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
                         ::
                         GetOpenApiVersion(rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>const&)
                         ::len);
  }
  OVar8 = kVersionNone;
  if ((document->data_).f.flags == 3) {
    pVVar4 = internal::
             Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
             ::GetSwaggerString();
    CVar5 = GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::FindMember<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        *)document,pVVar4);
    CVar6 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::MemberEnd(document);
    if (CVar5.ptr_ == CVar6.ptr_) {
      pVVar4 = internal::
               Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
               ::GetOpenApiString();
      CVar5 = GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::FindMember<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          *)document,pVVar4);
    }
    CVar6 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::MemberEnd(document);
    if (CVar5.ptr_ != CVar6.ptr_) {
      if ((undefined1  [16])
          ((undefined1  [16])((CVar5.ptr_)->value).data_ & (undefined1  [16])0x400000000000000) !=
          (undefined1  [16])0x0) {
        rhs = &(CVar5.ptr_)->value;
        kVersion20Value.data_.s.str = (Ch *)0x405000000159c35;
        kVersion20Value.data_.n = (Number)0x3;
        bVar1 = GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ::operator==((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)&kVersion20Value,rhs);
        if (bVar1) {
          return kVersion20;
        }
        kVersion30Value.data_.s.str = (Ch *)0x405000000159c39;
        kVersion30Value.data_.n = (Number)0x4;
        SVar2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetStringLength(rhs);
        if (GetOpenApiVersion::len < SVar2) {
          pCVar7 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::GetString(rhs);
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GenericValue(&kVersion31Value,pCVar7,GetOpenApiVersion::len);
          bVar1 = GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator==((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                *)&kVersion30Value,&kVersion31Value);
          if (bVar1) {
            return kVersion30;
          }
        }
        kVersion31Value.data_.s.str = (Ch *)0x405000000159c3e;
        kVersion31Value.data_.n = (Number)0x4;
        SVar2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetStringLength(rhs);
        if (GetOpenApiVersion::len < SVar2) {
          pCVar7 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::GetString(rhs);
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GenericValue(&local_38,pCVar7,GetOpenApiVersion::len);
          bVar1 = GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator==((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                *)&kVersion31Value,&local_38);
          return (uint)bVar1 + kVersionUnknown | kVersion31;
        }
      }
      OVar8 = kVersionUnknown;
    }
  }
  return OVar8;
}

Assistant:

static OpenApiVersion GetOpenApiVersion(const ValueType& document) {
        static const Ch kVersion20String[] = { '2', '.', '0', '\0' };
        static const Ch kVersion30String[] = { '3', '.', '0', '.', '\0' }; // ignore patch level
        static const Ch kVersion31String[] = { '3', '.', '1', '.', '\0' }; // ignore patch level
        static SizeType len = internal::StrLen<Ch>(kVersion30String);

        if (!document.IsObject()) {
            return kVersionNone;
        }

        // Get the open api version from the swagger / openapi keyword at the supplied location
        typename ValueType::ConstMemberIterator itr = document.FindMember(SchemaType::GetSwaggerString());
        if (itr == document.MemberEnd()) itr = document.FindMember(SchemaType::GetOpenApiString());
        if (itr != document.MemberEnd()) {
            if (!itr->value.IsString()) return kVersionUnknown;
            const ValueType kVersion20Value(kVersion20String);
            if (kVersion20Value == itr->value) return kVersion20; // must match 2.0 exactly
            const ValueType kVersion30Value(kVersion30String);
            if (itr->value.GetStringLength() > len && kVersion30Value == ValueType(itr->value.GetString(), len)) return kVersion30; // must match 3.0.x
            const ValueType kVersion31Value(kVersion31String);
            if (itr->value.GetStringLength() > len && kVersion31Value == ValueType(itr->value.GetString(), len)) return kVersion31; // must match 3.1.x
            return kVersionUnknown;
        }
        // swagger or openapi not found
        return kVersionNone;
    }